

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O1

int64_t get_warp_error(WarpedMotionParams *wm,int use_hbd,int bd,uint8_t *ref,int ref_width,
                      int ref_height,int ref_stride,uint8_t *dst,int dst_stride,int p_col,int p_row,
                      int p_width,int p_height,int subsampling_x,int subsampling_y,
                      int64_t best_error,uint8_t *segment_map,int segment_map_stride)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  long lVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  ulong uVar9;
  uint8_t *puVar10;
  ulong uVar11;
  long lVar12;
  uint8_t *puVar13;
  uint16_t *puVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint8_t *puVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  int64_t iVar25;
  undefined4 in_stack_00000034;
  undefined4 in_stack_0000003c;
  ConvolveParams conv_params;
  uint16_t tmp [1024];
  ulong local_940;
  ConvolveParams local_8a8;
  long local_878;
  long local_870;
  long local_868;
  uint16_t local_860 [1048];
  
  iVar6 = av1_get_shear_params(wm);
  if (iVar6 == 0) {
    iVar25 = 0x7fffffffffffffff;
  }
  else if (use_hbd == 0) {
    local_8a8.is_compound = 0;
    local_8a8.use_dist_wtd_comp_avg = 0;
    local_8a8.dst = (CONV_BUF_TYPE *)0x0;
    local_8a8.dst_stride = 0;
    local_8a8.round_0 = 3;
    local_8a8.round_1 = 0xb;
    local_8a8.plane = 0;
    local_8a8.do_average = 0;
    iVar25 = 0;
    if (0 < p_row) {
      lVar16 = (long)dst_stride;
      local_940 = 0;
      iVar25 = 0;
      puVar10 = dst;
      do {
        bVar2 = 0 < p_col;
        if (0 < p_col) {
          uVar19 = (uint)((long)ref_height - local_940);
          if (p_row < (int)uVar19) {
            uVar19 = p_row;
          }
          uVar11 = 0x20;
          if ((int)uVar19 < 0x20) {
            uVar11 = (ulong)uVar19;
          }
          bVar2 = true;
          uVar23 = 0;
          puVar18 = puVar10;
          uVar24 = ref_width;
          do {
            uVar8 = uVar24;
            if (p_col < (int)uVar24) {
              uVar8 = p_col;
            }
            if (0x1f < (int)uVar8) {
              uVar8 = 0x20;
            }
            if (*(char *)(CONCAT44(in_stack_0000003c,p_height) +
                         (long)((int)(uVar23 >> 5) + (int)(local_940 >> 5) * subsampling_x)) == '\0'
               ) {
              cVar5 = '\a';
            }
            else {
              iVar6 = (int)((long)ref_width - uVar23);
              if (p_col < iVar6) {
                iVar6 = p_col;
              }
              iVar7 = 0x20;
              if (iVar6 < 0x20) {
                iVar7 = iVar6;
              }
              warp_plane(wm,ref,ref_width,ref_height,ref_stride,(uint8_t *)local_860,(int)uVar23,
                         (int)local_940,iVar7,(int)uVar11,0x20,0,0,&local_8a8);
              if (((int)uVar19 < 0x20) || (iVar6 < 0x20)) {
                if ((long)((long)ref_height - local_940) < 1) {
                  uVar9 = 0;
                }
                else {
                  uVar9 = 0;
                  puVar14 = local_860;
                  iVar6 = 0;
                  puVar13 = puVar18;
                  do {
                    if (0 < (long)((long)ref_width - uVar23)) {
                      uVar21 = 0;
                      do {
                        uVar22 = (uint)puVar13[uVar21] - (uint)*(byte *)((long)puVar14 + uVar21);
                        uVar3 = -uVar22;
                        if (0 < (int)uVar22) {
                          uVar3 = uVar22;
                        }
                        iVar6 = iVar6 + (uVar3 & 0xff);
                        uVar21 = uVar21 + 1;
                      } while (uVar8 != uVar21);
                    }
                    uVar9 = uVar9 + 1;
                    puVar14 = puVar14 + 0x10;
                    puVar13 = puVar13 + lVar16;
                  } while (uVar9 != uVar11);
                  uVar9 = (ulong)iVar6;
                }
              }
              else {
                uVar8 = (*aom_sad32x32)((uint8_t *)local_860,0x20,dst + uVar23 + local_940 * lVar16,
                                        dst_stride);
                uVar9 = (ulong)uVar8;
              }
              iVar25 = iVar25 + uVar9;
              cVar5 = CONCAT44(in_stack_00000034,p_width) < iVar25;
            }
            if ((cVar5 != '\a') && (cVar5 != '\0')) break;
            uVar23 = uVar23 + 0x20;
            uVar24 = uVar24 - 0x20;
            puVar18 = puVar18 + 0x20;
            bVar2 = (long)uVar23 < (long)p_col;
          } while ((long)uVar23 < (long)p_col);
        }
        if (bVar2) {
          return 0x7fffffffffffffff;
        }
        local_940 = local_940 + 0x20;
        puVar10 = puVar10 + lVar16 * 0x20;
      } while (local_940 < (uint)p_row);
    }
  }
  else {
    local_8a8.round_0 = 3;
    local_8a8.round_1 = 0xb;
    if (10 < bd) {
      local_8a8.round_0 = bd + -7;
      local_8a8.round_1 = 0x15 - bd;
    }
    local_8a8.dst = (CONV_BUF_TYPE *)0x0;
    local_8a8.dst_stride = 0;
    local_8a8.plane = 0;
    local_8a8.do_average = 0;
    local_8a8.is_compound = 0;
    local_8a8.use_dist_wtd_comp_avg = 0;
    if (p_row < 1) {
      iVar25 = 0;
    }
    else {
      lVar16 = (long)dst * 2;
      local_870 = (long)dst_stride;
      local_878 = (long)ref_height;
      lVar17 = local_870 * 0x40;
      lVar4 = local_870 * 2;
      local_940 = 0;
      iVar25 = 0;
      local_868 = lVar16;
      do {
        bVar2 = 0 < p_col;
        if (0 < p_col) {
          lVar20 = local_878 - local_940;
          uVar19 = (uint)lVar20;
          if (p_row < (int)uVar19) {
            uVar19 = p_row;
          }
          uVar11 = 0x20;
          if ((int)uVar19 < 0x20) {
            uVar11 = (ulong)uVar19;
          }
          lVar1 = local_868 + local_940 * local_870 * 2;
          bVar2 = true;
          uVar23 = 0;
          lVar15 = lVar16;
          uVar24 = ref_width;
          do {
            uVar8 = uVar24;
            if (p_col < (int)uVar24) {
              uVar8 = p_col;
            }
            if (0x1f < (int)uVar8) {
              uVar8 = 0x20;
            }
            if (*(char *)(CONCAT44(in_stack_0000003c,p_height) +
                         (long)((int)(uVar23 >> 5) + (int)(local_940 >> 5) * subsampling_x)) == '\0'
               ) {
              cVar5 = '\a';
            }
            else {
              iVar6 = (int)((long)ref_width - uVar23);
              if (p_col < iVar6) {
                iVar6 = p_col;
              }
              iVar7 = 0x20;
              if (iVar6 < 0x20) {
                iVar7 = iVar6;
              }
              highbd_warp_plane(wm,(uint16_t *)((long)ref * 2),ref_width,ref_height,ref_stride,
                                local_860,(int)uVar23,(int)local_940,iVar7,(int)uVar11,0x20,0,0,bd,
                                &local_8a8);
              if (((int)uVar19 < 0x20) || (iVar6 < 0x20)) {
                if (lVar20 < 1) {
                  uVar9 = 0;
                }
                else {
                  uVar9 = 0;
                  puVar14 = local_860;
                  iVar6 = 0;
                  lVar12 = lVar15;
                  do {
                    if (0 < (long)((long)ref_width - uVar23)) {
                      uVar21 = 0;
                      do {
                        uVar22 = (uint)*(ushort *)(lVar12 + uVar21 * 2) - (uint)puVar14[uVar21];
                        uVar3 = -uVar22;
                        if (0 < (int)uVar22) {
                          uVar3 = uVar22;
                        }
                        iVar6 = iVar6 + (uVar3 & 0xffff);
                        uVar21 = uVar21 + 1;
                      } while (uVar8 != uVar21);
                    }
                    uVar9 = uVar9 + 1;
                    puVar14 = puVar14 + 0x20;
                    lVar12 = lVar12 + lVar4;
                  } while (uVar9 != uVar11);
                  uVar9 = (ulong)iVar6;
                }
              }
              else {
                uVar8 = (*aom_highbd_sad32x32)
                                  ((uint8_t *)((ulong)local_860 >> 1),0x20,
                                   (uint8_t *)(lVar1 + uVar23 * 2 >> 1),dst_stride);
                uVar9 = (ulong)uVar8;
              }
              iVar25 = iVar25 + uVar9;
              cVar5 = CONCAT44(in_stack_00000034,p_width) < iVar25;
            }
            if ((cVar5 != '\a') && (cVar5 != '\0')) break;
            uVar23 = uVar23 + 0x20;
            uVar24 = uVar24 - 0x20;
            lVar15 = lVar15 + 0x40;
            bVar2 = (long)uVar23 < (long)p_col;
          } while ((long)uVar23 < (long)p_col);
        }
        if (bVar2) {
          return 0x7fffffffffffffff;
        }
        local_940 = local_940 + 0x20;
        lVar16 = lVar16 + lVar17;
      } while (local_940 < (uint)p_row);
    }
  }
  return iVar25;
}

Assistant:

static int64_t get_warp_error(WarpedMotionParams *wm, int use_hbd, int bd,
                              const uint8_t *ref, int ref_width, int ref_height,
                              int ref_stride, uint8_t *dst, int dst_stride,
                              int p_col, int p_row, int p_width, int p_height,
                              int subsampling_x, int subsampling_y,
                              int64_t best_error, uint8_t *segment_map,
                              int segment_map_stride) {
  if (!av1_get_shear_params(wm)) return INT64_MAX;
#if CONFIG_AV1_HIGHBITDEPTH
  if (use_hbd)
    return highbd_warp_error(wm, CONVERT_TO_SHORTPTR(ref), ref_width,
                             ref_height, ref_stride, CONVERT_TO_SHORTPTR(dst),
                             dst_stride, p_col, p_row, p_width, p_height,
                             subsampling_x, subsampling_y, bd, best_error,
                             segment_map, segment_map_stride);
#endif
  (void)use_hbd;
  (void)bd;
  return warp_error(wm, ref, ref_width, ref_height, ref_stride, dst, dst_stride,
                    p_col, p_row, p_width, p_height, subsampling_x,
                    subsampling_y, best_error, segment_map, segment_map_stride);
}